

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_sound.cpp
# Opt level: O0

void S_PrecacheLevel(void)

{
  uint uVar1;
  sfxinfo_t *psVar2;
  FSoundID *this;
  FSoundChan *local_38;
  FSoundChan *chan;
  TThinkerIterator<AActor> iterator;
  AActor *actor;
  uint i;
  
  if (GSnd != (SoundRenderer *)0x0) {
    for (actor._4_4_ = 0; uVar1 = TArray<sfxinfo_t,_sfxinfo_t>::Size(&S_sfx), actor._4_4_ < uVar1;
        actor._4_4_ = actor._4_4_ + 1) {
      psVar2 = TArray<sfxinfo_t,_sfxinfo_t>::operator[](&S_sfx,(ulong)actor._4_4_);
      *(ushort *)&psVar2->field_0x30 = *(ushort *)&psVar2->field_0x30 & 0xffdf;
    }
    TThinkerIterator<AActor>::TThinkerIterator((TThinkerIterator<AActor> *)&chan,0x80);
    while (iterator.super_FThinkerIterator._16_8_ =
                TThinkerIterator<AActor>::Next((TThinkerIterator<AActor> *)&chan,false),
          (AActor *)iterator.super_FThinkerIterator._16_8_ != (AActor *)0x0) {
      (*(((AActor *)iterator.super_FThinkerIterator._16_8_)->super_DThinker).super_DObject.
        _vptr_DObject[0xc])();
    }
    iterator.super_FThinkerIterator.m_Stat = '\0';
    iterator.super_FThinkerIterator.m_SearchStats = false;
    iterator.super_FThinkerIterator.m_SearchingFresh = false;
    iterator.super_FThinkerIterator._19_5_ = 0;
    for (actor._4_4_ = 0; uVar1 = TArray<FSoundID,_FSoundID>::Size(&(level.info)->PrecacheSounds),
        actor._4_4_ < uVar1; actor._4_4_ = actor._4_4_ + 1) {
      this = TArray<FSoundID,_FSoundID>::operator[]
                       (&(level.info)->PrecacheSounds,(ulong)actor._4_4_);
      FSoundID::MarkUsed(this);
    }
    for (local_38 = Channels; local_38 != (FSoundChan *)0x0; local_38 = local_38->NextChan) {
      FSoundID::MarkUsed(&local_38->SoundID);
    }
    for (actor._4_4_ = 1; uVar1 = TArray<sfxinfo_t,_sfxinfo_t>::Size(&S_sfx), actor._4_4_ < uVar1;
        actor._4_4_ = actor._4_4_ + 1) {
      psVar2 = TArray<sfxinfo_t,_sfxinfo_t>::operator[](&S_sfx,(ulong)actor._4_4_);
      if ((*(ushort *)&psVar2->field_0x30 >> 5 & 1) != 0) {
        psVar2 = TArray<sfxinfo_t,_sfxinfo_t>::operator[](&S_sfx,(ulong)actor._4_4_);
        S_CacheSound(psVar2);
      }
    }
    for (actor._4_4_ = 1; uVar1 = TArray<sfxinfo_t,_sfxinfo_t>::Size(&S_sfx), actor._4_4_ < uVar1;
        actor._4_4_ = actor._4_4_ + 1) {
      psVar2 = TArray<sfxinfo_t,_sfxinfo_t>::operator[](&S_sfx,(ulong)actor._4_4_);
      if (((*(ushort *)&psVar2->field_0x30 >> 5 & 1) == 0) &&
         (psVar2 = TArray<sfxinfo_t,_sfxinfo_t>::operator[](&S_sfx,(ulong)actor._4_4_),
         psVar2->link == 0xffffffff)) {
        psVar2 = TArray<sfxinfo_t,_sfxinfo_t>::operator[](&S_sfx,(ulong)actor._4_4_);
        S_UnloadSound(psVar2);
      }
    }
  }
  return;
}

Assistant:

void S_PrecacheLevel ()
{
	unsigned int i;

	if (GSnd)
	{
		for (i = 0; i < S_sfx.Size(); ++i)
		{
			S_sfx[i].bUsed = false;
		}

		AActor *actor;
		TThinkerIterator<AActor> iterator;

		// Precache all sounds known to be used by the currently spawned actors.
		while ( (actor = iterator.Next()) != NULL )
		{
			actor->MarkPrecacheSounds();
		}
		// Precache all extra sounds requested by this map.
		for (i = 0; i < level.info->PrecacheSounds.Size(); ++i)
		{
			level.info->PrecacheSounds[i].MarkUsed();
		}
		// Don't unload sounds that are playing right now.
		for (FSoundChan *chan = Channels; chan != NULL; chan = chan->NextChan)
		{
			chan->SoundID.MarkUsed();
		}

		for (i = 1; i < S_sfx.Size(); ++i)
		{
			if (S_sfx[i].bUsed)
			{
				S_CacheSound (&S_sfx[i]);
			}
		}
		for (i = 1; i < S_sfx.Size(); ++i)
		{
			if (!S_sfx[i].bUsed && S_sfx[i].link == sfxinfo_t::NO_LINK)
			{
				S_UnloadSound (&S_sfx[i]);
			}
		}
	}
}